

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O0

int ed25519_set_priv_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  uint8_t *out_private_key;
  uint8_t local_58 [8];
  uint8_t pubkey_unused [32];
  ED25519_KEY *key;
  size_t len_local;
  uint8_t *in_local;
  EVP_PKEY *pkey_local;
  
  if (len == 0x20) {
    out_private_key = (uint8_t *)OPENSSL_malloc(0x41);
    if (out_private_key == (uint8_t *)0x0) {
      pkey_local._4_4_ = 0;
    }
    else {
      ED25519_keypair_from_seed(local_58,out_private_key,in);
      out_private_key[0x40] = '\x01';
      ed25519_free(pkey);
      pkey->pkey = out_private_key;
      pkey_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                  ,0x21);
    pkey_local._4_4_ = 0;
  }
  return pkey_local._4_4_;
}

Assistant:

static int ed25519_set_priv_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  ED25519_KEY *key =
      reinterpret_cast<ED25519_KEY *>(OPENSSL_malloc(sizeof(ED25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  // The RFC 8032 encoding stores only the 32-byte seed, so we must recover the
  // full representation which we use from it.
  uint8_t pubkey_unused[32];
  ED25519_keypair_from_seed(pubkey_unused, key->key, in);
  key->has_private = 1;

  ed25519_free(pkey);
  pkey->pkey = key;
  return 1;
}